

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_types.h
# Opt level: O0

kvs_ops_stat * __thiscall kvs_ops_stat::operator=(kvs_ops_stat *this,kvs_ops_stat *ops_stat)

{
  kvs_ops_stat *in_RDI;
  uint64_t in_stack_ffffffffffffffb8;
  atomic<unsigned_long> *new_val;
  atomic<unsigned_long> *in_stack_ffffffffffffffc0;
  atomic<unsigned_long> *atomic_val;
  
  atomic_get_uint64_t(in_stack_ffffffffffffffc0,(memory_order)(in_stack_ffffffffffffffb8 >> 0x20));
  atomic_store_uint64_t(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,memory_order_relaxed);
  new_val = &in_RDI->num_dels;
  atomic_get_uint64_t(in_stack_ffffffffffffffc0,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(in_stack_ffffffffffffffc0,(uint64_t)new_val,memory_order_relaxed);
  atomic_val = &in_RDI->num_commits;
  atomic_get_uint64_t(atomic_val,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(atomic_val,(uint64_t)new_val,memory_order_relaxed);
  atomic_get_uint64_t(atomic_val,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(atomic_val,(uint64_t)new_val,memory_order_relaxed);
  atomic_get_uint64_t(atomic_val,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(atomic_val,(uint64_t)new_val,memory_order_relaxed);
  atomic_get_uint64_t(atomic_val,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(atomic_val,(uint64_t)new_val,memory_order_relaxed);
  atomic_get_uint64_t(atomic_val,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(atomic_val,(uint64_t)new_val,memory_order_relaxed);
  return in_RDI;
}

Assistant:

kvs_ops_stat& operator=(const kvs_ops_stat& ops_stat) {
        atomic_store_uint64_t(&num_sets,
                              atomic_get_uint64_t(&ops_stat.num_sets,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_dels,
                              atomic_get_uint64_t(&ops_stat.num_dels,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_commits,
                              atomic_get_uint64_t(&ops_stat.num_commits,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_compacts,
                              atomic_get_uint64_t(&ops_stat.num_compacts,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_gets,
                              atomic_get_uint64_t(&ops_stat.num_gets,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_iterator_gets,
                              atomic_get_uint64_t(&ops_stat.num_iterator_gets,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_iterator_moves,
                              atomic_get_uint64_t(&ops_stat.num_iterator_moves,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        return *this;
    }